

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O1

InterfaceHandle __thiscall helics::CommonCore::getFilter(CommonCore *this,string_view name)

{
  BaseType BVar1;
  BasicHandleInfo *pBVar2;
  shared_mutex *__rwlock;
  
  __rwlock = &(this->handles).m_mutex;
  std::__shared_mutex_pthread::lock_shared(&__rwlock->_M_impl);
  pBVar2 = HandleManager::getInterfaceHandle(&(this->handles).m_obj,name,FILTER);
  pthread_rwlock_unlock((pthread_rwlock_t *)__rwlock);
  BVar1 = -1700000000;
  if ((pBVar2 != (BasicHandleInfo *)0x0) && (pBVar2->handleType == FILTER)) {
    BVar1 = (pBVar2->handle).handle.hid;
  }
  return (InterfaceHandle)BVar1;
}

Assistant:

InterfaceHandle CommonCore::getFilter(std::string_view name) const
{
    const auto* filt = handles.read(
        [&name](auto& hand) { return hand.getInterfaceHandle(name, InterfaceType::FILTER); });
    if ((filt != nullptr) && (filt->handleType == InterfaceType::FILTER)) {
        return filt->getInterfaceHandle();
    }
    return {};
}